

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsDirWrapper.cpp
# Opt level: O0

void * __thiscall TlsEntryWrapper::getPtr(TlsEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BYTE *ptr;
  offset_t myRaw;
  bufsize_t addrSize;
  offset_t firstRaw;
  offset_t firstVA;
  TlsEntryWrapper *pTStack_18;
  bool isOk;
  TlsEntryWrapper *this_local;
  
  if (this->parentDir == (TlsDirWrapper *)0x0) {
    this_local = (TlsEntryWrapper *)0x0;
  }
  else {
    firstVA._7_1_ = 0;
    pTStack_18 = this;
    uVar4 = ExeElementWrapper::getNumValue
                      ((ExeElementWrapper *)this->parentDir,3,(bool *)((long)&firstVA + 7));
    if (((firstVA._7_1_ & 1) == 0) || (uVar4 == 0)) {
      this_local = (TlsEntryWrapper *)0x0;
    }
    else {
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])(pEVar1,uVar4,3,0)
      ;
      if (CONCAT44(extraout_var,iVar2) == -1) {
        this_local = (TlsEntryWrapper *)0x0;
      }
      else {
        iVar3 = (*(this->parentDir->super_DataDirEntryWrapper).super_PENodeWrapper.
                  super_ExeNodeWrapper.super_ExeElementWrapper.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0x13])(this->parentDir,3,0xffffffffffffffff);
        pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
        iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                          (pEVar1,CONCAT44(extraout_var,iVar2) +
                                  CONCAT44(extraout_var_00,iVar3) *
                                  (this->super_ExeNodeWrapper).entryNum,1,
                           CONCAT44(extraout_var_00,iVar3),0);
        this_local = (TlsEntryWrapper *)CONCAT44(extraout_var_01,iVar2);
      }
    }
  }
  return this_local;
}

Assistant:

void* TlsEntryWrapper::getPtr()
{
    if (!this->parentDir) return nullptr;

    bool isOk = false;
    const offset_t firstVA = static_cast<offset_t>(this->parentDir->getNumValue(TlsDirWrapper::CALLBACKS_ADDR, &isOk));
    if (!isOk || (firstVA == 0)) return nullptr;

    const offset_t firstRaw = m_Exe->toRaw(firstVA, Executable::VA);
    if (firstRaw == INVALID_ADDR) {
        return nullptr;
    }

    const bufsize_t addrSize = this->parentDir->getFieldSize(TlsDirWrapper::CALLBACKS_ADDR);
    const offset_t myRaw = firstRaw + (addrSize * this->entryNum);
    BYTE *ptr  = m_Exe->getContentAt(myRaw, Executable::RAW, addrSize);
    return ptr;
}